

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O1

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,char (*u) [51])

{
  size_t size;
  
  size = strlen(*u);
  if ((char (*) [51])this->heap == u) {
    this->bufferSize = size;
  }
  else {
    reserve(this,size);
    this->bufferSize = size;
    if (size != 0) {
      memcpy(this->heap,u,size);
    }
  }
  return this;
}

Assistant:

SmallBuffer& operator=(U&& u)
    {
        std::string_view val(std::forward<U>(u));
        if (reinterpret_cast<const std::byte*>(val.data()) == heap) {
            bufferSize = val.size();
            return *this;
        }
        resize(val.size());
        if (val.size() > 0) {
            std::memcpy(heap, val.data(), val.size());
        }
        return *this;
    }